

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_suite.cpp
# Opt level: O0

void find_key_map(void)

{
  bool v;
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_6c8;
  undefined4 local_6bc;
  key_iterator local_6b8;
  key_iterator local_668;
  key_iterator local_618;
  key_iterator local_5c8;
  difference_type local_578;
  undefined4 local_56c;
  key_iterator local_568;
  key_iterator local_518;
  key_iterator local_4c8;
  key_iterator local_478;
  difference_type local_428;
  undefined4 local_41c;
  key_iterator local_418;
  key_iterator local_3c8;
  key_iterator local_378;
  key_iterator local_328;
  difference_type local_2d8 [2];
  key_iterator local_2c8;
  key_iterator local_278;
  key_iterator local_228;
  key_iterator local_1d8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_170;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_168;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [24];
  variable data;
  
  local_170 = &local_168;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[9],_true>
            (local_170,(char (*) [6])"alpha",(char (*) [9])"hydrogen");
  local_170 = &local_108;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[7],_true>
            (local_170,(char (*) [6])"bravo",(char (*) [7])"helium");
  local_170 = &local_a8;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[8],_true>
            (local_170,(char (*) [8])"charlie",(char (*) [8])"lithium");
  local_48._0_8_ = &local_168;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_6c8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_6c8 = local_6c8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_6c8);
  } while (local_6c8 != &local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            (&local_228,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_278,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator,char[9]>
            (&local_1d8,&local_228,&local_278,(char (*) [9])"hydrogen");
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_2c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  v = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator==
                (&local_1d8,&local_2c8);
  boost::detail::test_impl
            ("std::find(data.key_begin(), data.key_end(), \"hydrogen\") == data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x96,"void find_key_map()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_2c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            (&local_328,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            (&local_3c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_418,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator,char[6]>
            (&local_378,&local_3c8,&local_418,(char (*) [6])"alpha");
  local_2d8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator>
                           (&local_328,&local_378);
  local_41c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.key_begin(), std::find(data.key_begin(), data.key_end(), \"alpha\"))"
             ,"0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x99,"void find_key_map()",local_2d8,&local_41c);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            (&local_478,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            (&local_518,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_568,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator,char[6]>
            (&local_4c8,&local_518,&local_568,(char (*) [6])"bravo");
  local_428 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator>
                        (&local_478,&local_4c8);
  local_56c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.key_begin(), std::find(data.key_begin(), data.key_end(), \"bravo\"))"
             ,"1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x9c,"void find_key_map()",&local_428,&local_56c);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_4c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_568);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_478);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            (&local_5c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            (&local_668,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            (&local_6b8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::find<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator,char[8]>
            (&local_618,&local_668,&local_6b8,(char (*) [8])"charlie");
  local_578 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::key_iterator>
                        (&local_5c8,&local_618);
  local_6bc = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.key_begin(), std::find(data.key_begin(), data.key_end(), \"charlie\"))"
             ,"2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/find_suite.cpp"
             ,0x9f,"void find_key_map()",&local_578,&local_6bc);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_6b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator(&local_5c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void find_key_map()
{
    variable data = map::make(
        {
            {"alpha", "hydrogen"},
            {"bravo", "helium"},
            {"charlie", "lithium"}
        });
    // Iterator dereferences key
    TRIAL_PROTOCOL_TEST(std::find(data.key_begin(), data.key_end(), "hydrogen") == data.key_end());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.key_begin(),
                                            std::find(data.key_begin(), data.key_end(), "alpha")),
                              0);
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.key_begin(),
                                            std::find(data.key_begin(), data.key_end(), "bravo")),
                              1);
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.key_begin(),
                                            std::find(data.key_begin(), data.key_end(), "charlie")),
                              2);
}